

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::CompositeVariant(Layer *in_layer,Layer *composited_layer,string *warn,string *err)

{
  bool bVar1;
  ostream *poVar2;
  __node_base *p_Var3;
  bool bVar4;
  ostringstream ss_e;
  Layer dst;
  ostringstream local_1798 [376];
  Layer local_1620;
  
  if (composited_layer == (Layer *)0x0) {
    bVar4 = false;
  }
  else {
    Layer::Layer(&local_1620,in_layer);
    p_Var3 = &local_1620._prim_specs._M_h._M_before_begin;
    do {
      p_Var3 = p_Var3->_M_nxt;
      bVar4 = p_Var3 == (__node_base *)0x0;
      if (bVar4) {
        Layer::operator=(composited_layer,&local_1620);
        goto LAB_00173195;
      }
      bVar1 = anon_unknown_160::CompositeVariantRec(0,(PrimSpec *)(p_Var3 + 5),warn,err);
    } while (bVar1);
    ::std::__cxx11::ostringstream::ostringstream(local_1798);
    poVar2 = ::std::operator<<((ostream *)local_1798,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"CompositeVariant");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x439);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1798,"Composite `variantSet` failed.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1798);
LAB_00173195:
    Layer::~Layer(&local_1620);
  }
  return bVar4;
}

Assistant:

bool CompositeVariant(const Layer &in_layer, Layer *composited_layer,
                      std::string *warn, std::string *err) {
  if (!composited_layer) {
    return false;
  }

  Layer dst = in_layer;  // deep copy

  for (auto &item : dst.primspecs()) {
    if (!CompositeVariantRec(/* depth */ 0, item.second, warn, err)) {
      PUSH_ERROR_AND_RETURN("Composite `variantSet` failed.");
    }
  }

  (*composited_layer) = dst;

  DCOUT("Composite `variantSet` ok.");
  return true;
}